

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::dht_announce_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_announce_alert *this)

{
  uint uVar1;
  difference_type in_RCX;
  span<const_char> in;
  string local_148;
  string local_128;
  error_code ec;
  char msg [200];
  
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_148,&(this->ip).super_address,&ec);
  uVar1 = this->port;
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x14;
  aux::to_hex_abi_cxx11_(&local_128,(aux *)&this->info_hash,in);
  snprintf(msg,200,"incoming dht announce: %s:%d (%s)",local_148._M_dataplus._M_p,(ulong)uVar1,
           local_128._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,msg,(allocator<char> *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_announce_alert::message() const
	{
		error_code ec;
		char msg[200];
		std::snprintf(msg, sizeof(msg), "incoming dht announce: %s:%d (%s)"
			, ip.to_string(ec).c_str(), port, aux::to_hex(info_hash).c_str());
		return msg;
	}